

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall
ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator
          (ON_SubDMeshFragmentIterator *this,ON_SubDRef *subd_ref)

{
  ON_SubD *other_subd;
  ON_SubDFaceIterator local_60;
  ON_SubDRef *local_18;
  ON_SubDRef *subd_ref_local;
  ON_SubDMeshFragmentIterator *this_local;
  
  local_18 = subd_ref;
  subd_ref_local = (ON_SubDRef *)this;
  ON_SubDMesh::ON_SubDMesh(&this->m_limit_mesh);
  ON_SubD::ON_SubD(&this->m_subd);
  ON_SubDFaceIterator::ON_SubDFaceIterator(&this->m_fit);
  this->m_current_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_bFromFaceFragments = false;
  this->m_bHaveCounts = false;
  this->m_subd_appearance_override = Unset;
  this->m_reserved_density_reduction = '\0';
  this->m_maximum_mesh_density = 0;
  this->m_full_size_fragment_count = 0;
  this->m_half_size_fragment_count = 0;
  other_subd = ON_SubDRef::SubD(local_18);
  ON_SubD::ShareDimple(&this->m_subd,other_subd);
  ON_SubD::FaceIterator(&local_60,&this->m_subd);
  ON_SubDFaceIterator::operator=(&this->m_fit,&local_60);
  ON_SubDFaceIterator::~ON_SubDFaceIterator(&local_60);
  this->m_bFromFaceFragments = true;
  return;
}

Assistant:

ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator(ON_SubDRef& subd_ref)
{
  m_subd.ShareDimple(subd_ref.SubD());
  m_fit = m_subd.FaceIterator();
  m_bFromFaceFragments = true;
}